

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.h
# Opt level: O1

ImageNavigationHeader *
lrit::getHeader<lrit::ImageNavigationHeader>
          (ImageNavigationHeader *__return_storage_ptr__,Buffer *b,HeaderMap *m)

{
  _Base_ptr p_Var1;
  runtime_error *this;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  int *in_R9;
  char local_3c [4];
  string local_38;
  
  p_Var3 = &(m->_M_t)._M_impl.super__Rb_tree_header;
  p_Var2 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var3->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < 2]) {
    if (1 < (int)p_Var2[1]._M_color) {
      p_Var1 = p_Var2;
    }
  }
  p_Var2 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var3) && (p_Var2 = p_Var1, 2 < (int)p_Var1[1]._M_color)) {
    p_Var2 = &p_Var3->_M_header;
  }
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    getHeader<lrit::ImageNavigationHeader>(__return_storage_ptr__,b,*(int *)&p_Var2[1].field_0x4);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_3c[0] = -0x5b;
  local_3c[1] = '\0';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  util::str<char[37],char[89],char[2],int>
            (&local_38,(util *)"Assertion `it != m.end()` failed at ",
             (char (*) [37])
             "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/lrit/lrit.h"
             ,(char (*) [89])0x12162a,(char (*) [2])local_3c,in_R9);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

H getHeader(const Buffer& b, const HeaderMap& m) {
  auto it = m.find(H::CODE);
  ASSERT(it != m.end());
  return getHeader<H>(b, it->second);
}